

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

void __thiscall wabt::WastLexer::ReadWhitespace(WastLexer *this)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  
  pcVar2 = this->cursor_;
  iVar3 = this->line_;
  while( true ) {
    while( true ) {
      if (this->buffer_end_ <= pcVar2) {
        return;
      }
      cVar1 = *pcVar2;
      if (((cVar1 != '\t') && (cVar1 != '\r')) && (cVar1 != ' ')) break;
      pcVar2 = pcVar2 + 1;
      this->cursor_ = pcVar2;
    }
    if (cVar1 != '\n') break;
    pcVar2 = pcVar2 + 1;
    this->cursor_ = pcVar2;
    iVar3 = iVar3 + 1;
    this->line_ = iVar3;
    this->line_start_ = pcVar2;
  }
  return;
}

Assistant:

void WastLexer::ReadWhitespace() {
  while (true) {
    switch (PeekChar()) {
      case ' ':
      case '\t':
      case '\r':
        ReadChar();
        break;

      case '\n':
        ReadChar();
        Newline();
        break;

      default:
        return;
    }
  }
}